

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evthread_pthread.c
# Opt level: O1

int evthread_posix_cond_wait(void *cond_,void *lock_,timeval *tv)

{
  long lVar1;
  int iVar2;
  int iVar3;
  timespec ts;
  timeval now;
  timespec local_48;
  timeval local_38;
  
  if (tv == (timeval *)0x0) {
    iVar3 = pthread_cond_wait((pthread_cond_t *)cond_,(pthread_mutex_t *)lock_);
    iVar3 = -(uint)(iVar3 != 0);
  }
  else {
    gettimeofday(&local_38,(__timezone_ptr_t)0x0);
    lVar1 = tv->tv_usec + local_38.tv_usec;
    local_48.tv_nsec = tv->tv_usec + -1000000 + local_38.tv_usec;
    if (lVar1 < 1000000) {
      local_48.tv_nsec = lVar1;
    }
    local_48.tv_sec = (ulong)(999999 < lVar1) + tv->tv_sec + local_38.tv_sec;
    local_48.tv_nsec = local_48.tv_nsec * 1000;
    iVar2 = pthread_cond_timedwait((pthread_cond_t *)cond_,(pthread_mutex_t *)lock_,&local_48);
    iVar3 = 1;
    if (iVar2 != 0x6e) {
      iVar3 = -(uint)(iVar2 != 0);
    }
  }
  return iVar3;
}

Assistant:

static int
evthread_posix_cond_wait(void *cond_, void *lock_, const struct timeval *tv)
{
	int r;
	pthread_cond_t *cond = cond_;
	pthread_mutex_t *lock = lock_;

	if (tv) {
		struct timeval now, abstime;
		struct timespec ts;
		evutil_gettimeofday(&now, NULL);
		evutil_timeradd(&now, tv, &abstime);
		ts.tv_sec = abstime.tv_sec;
		ts.tv_nsec = abstime.tv_usec*1000;
		r = pthread_cond_timedwait(cond, lock, &ts);
		if (r == ETIMEDOUT)
			return 1;
		else if (r)
			return -1;
		else
			return 0;
	} else {
		r = pthread_cond_wait(cond, lock);
		return r ? -1 : 0;
	}
}